

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball_view.cpp
# Opt level: O0

void __thiscall lumeview::ArcBallView::ArcBallView(ArcBallView *this)

{
  Camera *this_00;
  quat *rot;
  ArcBallView *this_local;
  
  WindowEventListener::WindowEventListener(&this->super_WindowEventListener);
  (this->super_WindowEventListener)._vptr_WindowEventListener =
       (_func_int **)&PTR__ArcBallView_0029ad88;
  View::View(&this->m_view);
  ArcBall::ArcBall(&this->m_arcBall);
  this_00 = View::camera(&this->m_view);
  rot = ArcBall::rotation_quaternion(&this->m_arcBall);
  Camera::set_rotation(this_00,rot);
  return;
}

Assistant:

ArcBallView::ArcBallView ()
{
	m_view.camera().set_rotation (m_arcBall.rotation_quaternion ());
}